

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fillpoints.cc
# Opt level: O1

void re2c::calc_fill(dfa_t *dfa,vector<bool,_std::allocator<bool>_> *trivial,
                    vector<unsigned_long,_std::allocator<unsigned_long>_> *fill,size_t i)

{
  pointer puVar1;
  size_t *psVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar1 = (fill->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((puVar1[i] == 0xfffffffffffffffe) && (puVar1[i] = 0, dfa->nchars != 0)) {
    psVar2 = (dfa->states).
             super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
             super__Vector_impl_data._M_start[i]->arcs;
    uVar5 = 0;
    do {
      uVar4 = psVar2[uVar5];
      if (uVar4 != 0xffffffffffffffff) {
        calc_fill(dfa,trivial,fill,uVar4);
        uVar3 = uVar4 + 0x3f;
        if (-1 < (long)uVar4) {
          uVar3 = uVar4;
        }
        if (((trivial->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar3 >> 6) +
              (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar4 & 0x3f) & 1) == 0) {
          uVar4 = 1;
        }
        else {
          uVar4 = (fill->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar4] + 1;
        }
        puVar1 = (fill->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar1[i] < uVar4) {
          puVar1[i] = uVar4;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < dfa->nchars);
  }
  return;
}

Assistant:

static void calc_fill(
	const dfa_t &dfa,
	const std::vector<bool> &trivial,
	std::vector<size_t> &fill,
	size_t i)
{
	if (fill[i] == UNDEFINED)
	{
		fill[i] = 0;
		const size_t *arcs = dfa.states[i]->arcs;
		for (size_t c = 0; c < dfa.nchars; ++c)
		{
			const size_t j = arcs[c];
			if (j != dfa_t::NIL)
			{
				calc_fill(dfa, trivial, fill, j);
				size_t max = 1;
				if (trivial[j])
				{
					max += fill[j];
				}
				if (max > fill[i])
				{
					fill[i] = max;
				}
			}
		}
	}
}